

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O2

Instr * LowererMD::ChangeToWriteBarrierAssign(Instr *assignInstr,Func *func)

{
  Opnd *this;
  ThreadContextInfo *pTVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  IndirOpnd *this_00;
  undefined4 *puVar5;
  Instr *pIVar6;
  MemRefOpnd *pMVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char *pcVar8;
  char *error;
  uint lineNumber;
  
  this = assignInstr->m_dst;
  if (TySize[this->m_type] != 8) goto LAB_005d5798;
  pTVar1 = func->topFunc->m_threadContextInfo;
  bVar3 = IR::Opnd::IsIndirOpnd(this);
  if (bVar3) {
    this_00 = IR::Opnd::AsIndirOpnd(this);
    bVar3 = IR::IndirOpnd::HasAddrKind(this_00);
    if (!bVar3) goto LAB_005d5716;
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    error = "(!dest->AsIndirOpnd()->HasAddrKind())";
    pcVar8 = "!dest->AsIndirOpnd()->HasAddrKind()";
    lineNumber = 0xfdc;
  }
  else {
    bVar3 = IR::Opnd::IsMemRefOpnd(this);
    if (!bVar3) {
LAB_005d5798:
      ChangeToAssignNoBarrierCheck(assignInstr);
      return assignInstr;
    }
    pMVar7 = IR::Opnd::AsMemRefOpnd(this);
    pcVar8 = (char *)pMVar7->m_memLoc;
    if ((((((ulong)pcVar8 & 7) != 0 || pcVar8 == (char *)0x0) ||
         (iVar4 = (*pTVar1->_vptr_ThreadContextInfo[5])(pTVar1),
         pcVar8 == (char *)CONCAT44(extraout_var,iVar4))) ||
        (iVar4 = (*pTVar1->_vptr_ThreadContextInfo[4])(pTVar1),
        pcVar8 == (char *)CONCAT44(extraout_var_00,iVar4))) ||
       (iVar4 = (*pTVar1->_vptr_ThreadContextInfo[9])(pTVar1),
       pcVar8 == (char *)CONCAT44(extraout_var_01,iVar4))) goto LAB_005d5798;
    bVar3 = Memory::Recycler::WBCheckIsRecyclerAddress(pcVar8);
    if (bVar3) goto LAB_005d5716;
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    error = "(Recycler::WBCheckIsRecyclerAddress((char*)destAddr))";
    pcVar8 = "Recycler::WBCheckIsRecyclerAddress((char*)destAddr)";
    lineNumber = 0xfeb;
  }
  bVar3 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                     ,lineNumber,error,pcVar8);
  if (!bVar3) {
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  *puVar5 = 0;
LAB_005d5716:
  ChangeToAssignNoBarrierCheck(assignInstr);
  if (assignInstr->m_opcode != MOV) {
    return assignInstr;
  }
  bVar3 = IR::Opnd::IsWriteBarrierTriggerableValue(assignInstr->m_src1);
  if (!bVar3) {
    return assignInstr;
  }
  pIVar6 = GenerateWriteBarrier(assignInstr);
  return pIVar6;
}

Assistant:

IR::Instr *
LowererMD::ChangeToWriteBarrierAssign(IR::Instr * assignInstr, const Func* func)
{
#ifdef RECYCLER_WRITE_BARRIER_JIT
    IR::Opnd* dest = assignInstr->GetDst();

    auto threadContextInfo = func->GetTopFunc()->GetThreadContextInfo();
    void* destAddr = nullptr;
    bool isPossibleBarrieredDest = false;

    if (TySize[dest->GetType()] == sizeof(void*))
    {
        if (dest->IsIndirOpnd())
        {
            Assert(!dest->AsIndirOpnd()->HasAddrKind());
            isPossibleBarrieredDest = true;
        }
        else if (dest->IsMemRefOpnd())
        {
            // looks all thread context field access are from MemRefOpnd
            destAddr = (void*)dest->AsMemRefOpnd()->GetMemLoc();
            isPossibleBarrieredDest = destAddr != nullptr
                && ((intptr_t)destAddr % sizeof(void*)) == 0
                && destAddr != (void*)threadContextInfo->GetImplicitCallFlagsAddr()
                && destAddr != (void*)threadContextInfo->GetDisableImplicitFlagsAddr()
                && destAddr != (void*)threadContextInfo->GetBailOutRegisterSaveSpaceAddr();

            if (isPossibleBarrieredDest)
            {
                Assert(Recycler::WBCheckIsRecyclerAddress((char*)destAddr));
            }
        }
    }
#endif

    IR::Instr * instr = ChangeToAssignNoBarrierCheck(assignInstr);

    // Now insert write barrier if necessary
#ifdef RECYCLER_WRITE_BARRIER_JIT
    if (isPossibleBarrieredDest
        && assignInstr->m_opcode == Js::OpCode::MOV // ignore SSE instructions like MOVSD
        && assignInstr->GetSrc1()->IsWriteBarrierTriggerableValue())
    {
        instr = LowererMD::GenerateWriteBarrier(assignInstr);
    }
#endif

    return instr;
}